

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_base.h
# Opt level: O0

void __thiscall tower120::trackable_base::move_ctr(trackable_base *this,trackable_base *other)

{
  anon_class_8_1_8991fb9c local_20;
  trackable_base *local_18;
  trackable_base *other_local;
  trackable_base *this_local;
  
  this->first_ptr = other->first_ptr;
  other->first_ptr = (trackable_ptr_base *)0x0;
  local_20.this = this;
  local_18 = other;
  other_local = this;
  foreach_ptr<tower120::trackable_base::move_ctr(tower120::trackable_base&)::_lambda(tower120::detail::trackable_ptr_base*)_1_>
            (this,&local_20);
  return;
}

Assistant:

void move_ctr(trackable_base& other) noexcept {
            // update trackers with new pointer
            first_ptr       = other.first_ptr;
            other.first_ptr = nullptr;

            foreach_ptr([&](detail::trackable_ptr_base* ptr){
                get_obj(ptr) = this;
            });
        }